

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O2

RatiotestResult
ratiotest_textbook(Runtime *rt,QpVector *p,QpVector *rowmove,Instance *instance,double alphastart)

{
  double t;
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong unaff_R12;
  ulong uVar12;
  double dVar13;
  RatiotestResult RVar14;
  double local_88;
  
  piVar5 = (p->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar6 = (rt->primal).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (p->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (instance->var_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (instance->var_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  t = (rt->settings).ratiotest_t;
  iVar2 = instance->num_con;
  uVar12 = 0;
  uVar10 = (ulong)(uint)p->num_nz;
  if (p->num_nz < 1) {
    uVar10 = uVar12;
  }
  uVar11 = 0xffffffffffffffff;
  local_88 = alphastart;
  for (; uVar10 != uVar12; uVar12 = uVar12 + 1) {
    iVar3 = piVar5[uVar12];
    dVar1 = pdVar7[iVar3];
    dVar13 = step(pdVar6[iVar3],dVar1,pdVar8[iVar3],pdVar9[iVar3],t);
    uVar11 = uVar11 & 0xffffffff;
    if (dVar13 < local_88) {
      uVar11 = (ulong)(uint)(iVar2 + iVar3);
    }
    unaff_R12 = unaff_R12 & 0xff;
    if (dVar13 < local_88) {
      unaff_R12 = (ulong)(dVar1 < 0.0);
      local_88 = dVar13;
    }
  }
  piVar5 = (rowmove->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (rt->rowactivity).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (rowmove->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (instance->con_lo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (instance->con_up).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar10 = (ulong)(uint)rowmove->num_nz;
  if (rowmove->num_nz < 1) {
    uVar10 = uVar12;
  }
  for (; unaff_R12 = unaff_R12 & 0xff, uVar10 != uVar12; uVar12 = uVar12 + 1) {
    uVar4 = piVar5[uVar12];
    dVar1 = pdVar7[(int)uVar4];
    dVar13 = step(pdVar6[(int)uVar4],dVar1,pdVar8[(int)uVar4],pdVar9[(int)uVar4],t);
    uVar11 = uVar11 & 0xffffffff;
    if (dVar13 < local_88) {
      uVar11 = (ulong)uVar4;
      unaff_R12 = (ulong)(dVar1 < 0.0);
      local_88 = dVar13;
    }
  }
  RVar14._8_8_ = uVar11 & 0xffffffff | unaff_R12 << 0x20;
  RVar14.alpha = local_88;
  return RVar14;
}

Assistant:

static RatiotestResult ratiotest_textbook(Runtime& rt, const QpVector& p,
                                          const QpVector& rowmove,
                                          Instance& instance,
                                          const double alphastart) {
  RatiotestResult result;
  result.limitingconstraint = -1;
  result.alpha = alphastart;

  // check ratio towards variable bounds
  for (HighsInt j = 0; j < p.num_nz; j++) {
    HighsInt i = p.index[j];
    double alpha_i = step(rt.primal.value[i], p.value[i], instance.var_lo[i],
                          instance.var_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = instance.num_con + i;
      result.nowactiveatlower = p.value[i] < 0;
    }
  }

  // check ratio towards constraint bounds
  for (HighsInt j = 0; j < rowmove.num_nz; j++) {
    HighsInt i = rowmove.index[j];
    double alpha_i =
        step(rt.rowactivity.value[i], rowmove.value[i], instance.con_lo[i],
             instance.con_up[i], rt.settings.ratiotest_t);
    if (alpha_i < result.alpha) {
      result.alpha = alpha_i;
      result.limitingconstraint = i;
      result.nowactiveatlower = rowmove.value[i] < 0;
    }
  }

  return result;
}